

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

Value * __thiscall
soul::Value::toExternalValue
          (Value *__return_storage_ptr__,Value *this,ConstantTable *constantTable,
          StringDictionary *stringDictionary)

{
  ConversionState c;
  ConstantTable *local_18;
  StringDictionary *local_10;
  
  local_18 = constantTable;
  local_10 = stringDictionary;
  toExternalValue(soul::ConstantTable_const&,soul::StringDictionary_const&)::Value_const__
            (__return_storage_ptr__,&local_18,this);
  return __return_storage_ptr__;
}

Assistant:

choc::value::Value Value::toExternalValue (const ConstantTable& constantTable, const StringDictionary& stringDictionary) const
{
    // put all conversion state into a single object to avoid lambdas needing to capture more than a single pointer to the state
    struct ConversionState
    {
        const ConstantTable& constants;
        const StringDictionary& dictionary;

        choc::value::Value convert (const Value& source)
        {
            const auto& sourceType = source.getType();

            if (sourceType.isPrimitive())
            {
                if (sourceType.isInteger32())   return choc::value::createInt32 (source.getAsInt32());
                if (sourceType.isInteger64())   return choc::value::createInt64 (source.getAsInt64());
                if (sourceType.isFloat32())     return choc::value::createFloat32 (source.getAsFloat());
                if (sourceType.isFloat64())     return choc::value::createFloat64 (source.getAsDouble());
                if (sourceType.isBool())        return choc::value::createBool (source.getAsBool());
            }

            if (sourceType.isStringLiteral())
                return choc::value::createString (dictionary.getStringForHandle (source.getStringLiteral()));

            if (sourceType.isVector())
            {
                auto size = static_cast<uint32_t> (sourceType.getVectorSize());
                auto elementType = sourceType.getElementType();

                if (elementType.isInteger32())   return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsInt32(); });
                if (elementType.isInteger64())   return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsInt64(); });
                if (elementType.isFloat32())     return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsFloat(); });
                if (elementType.isFloat64())     return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsDouble(); });
                if (elementType.isBool())        return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsBool(); });
            }

            if (sourceType.isUnsizedArray())
            {
                auto target = constants.getValueForHandle (source.getUnsizedArrayContent());
                SOUL_ASSERT (target != nullptr);
                return convert (*target);
            }

            if (sourceType.isArray())
                return choc::value::createArray (static_cast<uint32_t> (sourceType.getArraySize()),
                                                 [&] (uint32_t i) { return convert (source.getSubElement (i)); });

            if (sourceType.isStruct())
            {
                auto& s = sourceType.getStructRef();
                auto o = choc::value::createObject (s.getName());
                size_t i = 0;

                for (auto& m : s.getMembers())
                    o.addMember (m.name, convert (source.getSubElement (i++)));

                return o;
            }

            SOUL_ASSERT_FALSE;
            return {};
        }
    };

    ConversionState c { constantTable, stringDictionary };
    return c.convert (*this);
}